

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  int32 iVar4;
  int32 iVar5;
  uint32 uVar6;
  uint32 uVar7;
  string *psVar8;
  byte extraout_var;
  LogMessage *other;
  int64 iVar9;
  int64 iVar10;
  uint64 uVar11;
  uint64 uVar12;
  LogFinisher local_51;
  LogMessage local_50;
  
  CVar3 = MapKey::type(a);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar4 = MapKey::GetInt32Value(a);
    iVar5 = MapKey::GetInt32Value(b);
    bVar1 = SBORROW4(iVar4,iVar5);
    bVar2 = iVar4 - iVar5 < 0;
    goto LAB_002a58fc;
  case CPPTYPE_INT64:
    iVar9 = MapKey::GetInt64Value(a);
    iVar10 = MapKey::GetInt64Value(b);
    bVar1 = SBORROW8(iVar9,iVar10);
    bVar2 = iVar9 - iVar10 < 0;
LAB_002a58fc:
    bVar2 = bVar1 != bVar2;
    break;
  case CPPTYPE_UINT32:
    uVar6 = MapKey::GetUInt32Value(a);
    uVar7 = MapKey::GetUInt32Value(b);
    bVar2 = uVar6 < uVar7;
    break;
  case CPPTYPE_UINT64:
    uVar11 = MapKey::GetUInt64Value(a);
    uVar12 = MapKey::GetUInt64Value(b);
    bVar2 = uVar11 < uVar12;
    break;
  default:
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x321);
    other = LogMessage::operator<<(&local_50,"Invalid key for map field.");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    bVar2 = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(a);
    bVar2 = MapKey::GetBoolValue(b);
    bVar2 = !bVar1 && bVar2;
    break;
  case CPPTYPE_STRING:
    psVar8 = MapKey::GetStringValue_abi_cxx11_(a);
    MapKey::GetStringValue_abi_cxx11_(b);
    std::__cxx11::string::compare((string *)psVar8);
    bVar2 = (bool)(extraout_var >> 7);
  }
  return bVar2;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }